

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.cpp
# Opt level: O0

void __thiscall
QSharedMemoryPrivate::setUnixErrorString(QSharedMemoryPrivate *this,QLatin1StringView function)

{
  int *piVar1;
  long in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QString *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  int iVar2;
  char *s;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar3;
  QLatin1String *in_stack_fffffffffffffe68;
  QString *this_00;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  QChar in_stack_fffffffffffffeae;
  QChar local_f2;
  char local_f0 [54];
  QChar local_ba;
  QString local_b8 [2];
  QChar local_82 [28];
  QChar local_4a [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  piVar1 = __errno_location();
  switch(*piVar1) {
  case 2:
    this_00 = local_b8;
    QSharedMemory::tr(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe4c);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    QChar::QChar<char16_t,_true>(&local_ba,L' ');
    QString::arg<QLatin1String,_true>
              (this_00,(QLatin1String *)
                       CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),iVar2,
               in_stack_fffffffffffffeae);
    QString::operator=(in_stack_fffffffffffffe50,
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0x26178a);
    QString::~QString((QString *)0x261797);
    *(undefined4 *)(in_RDI + 0xd4) = 5;
    break;
  default:
    QSharedMemory::tr(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe4c);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    __errno_location();
    qt_error_string(iVar2);
    QString::arg<QLatin1String&,QString>
              ((QString *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,
               (QString *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
    QString::operator=(in_stack_fffffffffffffe50,
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0x261915);
    QString::~QString((QString *)0x26191f);
    QString::~QString((QString *)0x26192c);
    *(undefined4 *)(in_RDI + 0xd4) = 8;
    break;
  case 0xc:
  case 0x18:
  case 0x1c:
    uVar3 = 0;
    s = local_f0;
    QSharedMemory::tr(s,(char *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    iVar2 = (int)((ulong)s >> 0x20);
    QChar::QChar<char16_t,_true>(&local_f2,L' ');
    QString::arg<QLatin1String,_true>
              ((QString *)in_stack_fffffffffffffe68,
               (QLatin1String *)CONCAT44(uVar3,in_stack_fffffffffffffe60),iVar2,
               in_stack_fffffffffffffeae);
    QString::operator=(in_stack_fffffffffffffe50,
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0x261856);
    QString::~QString((QString *)0x261863);
    *(undefined4 *)(in_RDI + 0xd4) = 7;
    break;
  case 0xd:
    QSharedMemory::tr(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe4c);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    QChar::QChar<char16_t,_true>(local_4a,L' ');
    QString::arg<QLatin1String,_true>
              ((QString *)in_stack_fffffffffffffe68,
               (QLatin1String *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),iVar2,
               in_stack_fffffffffffffeae);
    QString::operator=(in_stack_fffffffffffffe50,
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0x2615f2);
    QString::~QString((QString *)0x2615ff);
    *(undefined4 *)(in_RDI + 0xd4) = 1;
    break;
  case 0x11:
    QSharedMemory::tr(in_stack_fffffffffffffe58,(char *)in_stack_fffffffffffffe50,
                      in_stack_fffffffffffffe4c);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    QChar::QChar<char16_t,_true>(local_82,L' ');
    QString::arg<QLatin1String,_true>
              ((QString *)in_stack_fffffffffffffe68,
               (QLatin1String *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),iVar2,
               in_stack_fffffffffffffeae);
    QString::operator=(in_stack_fffffffffffffe50,
                       (QString *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    QString::~QString((QString *)0x2616be);
    QString::~QString((QString *)0x2616cb);
    *(undefined4 *)(in_RDI + 0xd4) = 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSharedMemoryPrivate::setUnixErrorString(QLatin1StringView function)
{
    // EINVAL is handled in functions so they can give better error strings
    switch (errno) {
    case EACCES:
        errorString = QSharedMemory::tr("%1: permission denied").arg(function);
        error = QSharedMemory::PermissionDenied;
        break;
    case EEXIST:
        errorString = QSharedMemory::tr("%1: already exists").arg(function);
        error = QSharedMemory::AlreadyExists;
        break;
    case ENOENT:
        errorString = QSharedMemory::tr("%1: doesn't exist").arg(function);
        error = QSharedMemory::NotFound;
        break;
    case EMFILE:
    case ENOMEM:
    case ENOSPC:
        errorString = QSharedMemory::tr("%1: out of resources").arg(function);
        error = QSharedMemory::OutOfResources;
        break;
    default:
        errorString = QSharedMemory::tr("%1: unknown error: %2")
                .arg(function, qt_error_string(errno));
        error = QSharedMemory::UnknownError;
#if defined QSHAREDMEMORY_DEBUG
        qDebug() << errorString << "key" << key << "errno" << errno << EINVAL;
#endif
    }
}